

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile_amend.c
# Opt level: O0

LY_ERR lysp_qname_dup(ly_ctx *ctx,lysp_qname *orig_qname,lysp_qname *qname)

{
  LY_ERR ret;
  lysp_qname *qname_local;
  lysp_qname *orig_qname_local;
  ly_ctx *ctx_local;
  
  if (orig_qname->str == (char *)0x0) {
    ctx_local._4_4_ = LY_SUCCESS;
  }
  else {
    ctx_local._4_4_ = lydict_dup(ctx,orig_qname->str,&qname->str);
    if (orig_qname->mod == (lysp_module *)0x0) {
      __assert_fail("orig_qname->mod",
                    "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/schema_compile_amend.c"
                    ,0x21b,
                    "LY_ERR lysp_qname_dup(const struct ly_ctx *, const struct lysp_qname *, struct lysp_qname *)"
                   );
    }
    qname->mod = orig_qname->mod;
  }
  return ctx_local._4_4_;
}

Assistant:

LY_ERR
lysp_qname_dup(const struct ly_ctx *ctx, const struct lysp_qname *orig_qname, struct lysp_qname *qname)
{
    LY_ERR ret = LY_SUCCESS;

    if (!orig_qname->str) {
        return LY_SUCCESS;
    }

    DUP_STRING(ctx, orig_qname->str, qname->str, ret);
    assert(orig_qname->mod);
    qname->mod = orig_qname->mod;

    return ret;
}